

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasEnumDefinitions(Descriptor *message_type)

{
  bool bVar1;
  ulong uVar2;
  Descriptor *message_type_00;
  ulong uVar3;
  
  bVar1 = true;
  if (*(int *)(message_type + 0x74) < 1) {
    uVar3 = (ulong)*(int *)(message_type + 0x70);
    if ((long)uVar3 < 1) {
      bVar1 = false;
    }
    else {
      message_type_00 = *(Descriptor **)(message_type + 0x38);
      uVar2 = 0;
      do {
        bVar1 = HasEnumDefinitions(message_type_00);
        if (bVar1) {
          return true;
        }
        uVar2 = uVar2 + 1;
        message_type_00 = message_type_00 + 0x88;
      } while (uVar3 != uVar2);
      bVar1 = uVar2 < uVar3;
    }
  }
  return bVar1;
}

Assistant:

static bool HasEnumDefinitions(const Descriptor* message_type) {
  if (message_type->enum_type_count() > 0) return true;
  for (int i = 0; i < message_type->nested_type_count(); ++i) {
    if (HasEnumDefinitions(message_type->nested_type(i))) return true;
  }
  return false;
}